

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O1

void iemgui_send(void *x,t_iemgui *iemgui,t_symbol *s)

{
  t_iem_fstyle_flags tVar1;
  int iVar2;
  t_symbol *ptVar3;
  uint uVar4;
  
  tVar1 = iemgui->x_fsf;
  if (s == (t_symbol *)0x0) {
    iemgui->x_snd_unexpanded = &s_;
    ptVar3 = (t_symbol *)0x0;
    uVar4 = 0;
  }
  else {
    iemgui->x_snd_unexpanded = s;
    ptVar3 = canvas_realizedollar(iemgui->x_glist,s);
    uVar4 = 0x80;
  }
  iemgui->x_snd = ptVar3;
  iemgui->x_fsf = (t_iem_fstyle_flags)((uint)iemgui->x_fsf & 0xffffff7f | uVar4);
  iemgui_verify_snd_ne_rcv(iemgui);
  iVar2 = glist_isvisible(iemgui->x_glist);
  if (iVar2 != 0) {
    iVar2 = gobj_shouldvis((t_gobj *)x,iemgui->x_glist);
    if (iVar2 != 0) {
      (*iemgui->x_draw)(x,iemgui->x_glist,((uint)tVar1 >> 5 & 2) + ((uint)tVar1 >> 7 & 1) + 6);
      return;
    }
  }
  return;
}

Assistant:

void iemgui_send(void *x, t_iemgui *iemgui, t_symbol *s)
{
    int sndable=1, oldsndrcvable=0;

    if(iemgui->x_fsf.x_rcv_able)
        oldsndrcvable |= IEM_GUI_OLD_RCV_FLAG;
    if(iemgui->x_fsf.x_snd_able)
        oldsndrcvable |= IEM_GUI_OLD_SND_FLAG;

    if(s) {
        iemgui->x_snd_unexpanded = s;
        iemgui->x_snd = canvas_realizedollar(iemgui->x_glist, s);
    } else {
        iemgui->x_snd_unexpanded = &s_;
        iemgui->x_snd = 0;
        sndable = 0;
    }
    iemgui->x_fsf.x_snd_able = sndable;
    iemgui_verify_snd_ne_rcv(iemgui);
    if(glist_isvisible(iemgui->x_glist) && gobj_shouldvis((t_gobj *)x, iemgui->x_glist))
        (*iemgui->x_draw)(x, iemgui->x_glist, IEM_GUI_DRAW_MODE_IO + oldsndrcvable);
}